

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall
IO::momentsActive(IO *this,vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims,
                 string *filename)

{
  ModelInstance *pMVar1;
  bool bVar2;
  reference ppMVar3;
  reference pvVar4;
  reference pfVar5;
  ostream *poVar6;
  iterator iStack_288;
  float i_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  iterator iStack_268;
  float i;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  ModelInstance *model;
  iterator __end1;
  iterator __begin1;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *sims_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin(sims);
  model = (ModelInstance *)std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end(sims)
  ;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                                *)&model);
    if (!bVar2) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
              ::operator*(&__end1);
    pMVar1 = *ppMVar3;
    pvVar4 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                       (&pMVar1->dimersactive,0);
    __end2 = std::vector<float,_std::allocator<float>_>::begin(pvVar4);
    iStack_268 = std::vector<float,_std::allocator<float>_>::end(pvVar4);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffd98);
      if (!bVar2) break;
      pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&__end2);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_220,*pfVar5);
      std::operator<<(poVar6,"\t");
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&__end2);
    }
    std::ostream::operator<<((ostream *)local_220,std::endl<char,std::char_traits<char>>);
    pvVar4 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                       (&pMVar1->dimersactive,1);
    __end2_1 = std::vector<float,_std::allocator<float>_>::begin(pvVar4);
    iStack_288 = std::vector<float,_std::allocator<float>_>::end(pvVar4);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffd78);
      if (!bVar2) break;
      pfVar5 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator*(&__end2_1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_220,*pfVar5);
      std::operator<<(poVar6,"\t");
      __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::operator++
                (&__end2_1);
    }
    std::ostream::operator<<((ostream *)local_220,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::momentsActive(std::vector<ModelInstance*> sims, std::string filename){
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (ModelInstance* model: sims){
		for (auto i: model->dimersactive.at(0)){
			outstream << i << "\t";
		}
		outstream << std::endl;
		for (auto i: model->dimersactive.at(1)){
			outstream << i << "\t";
		}
		outstream << std::endl;
	}
	outstream.close();
}